

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O1

void __thiscall deqp::egl::Image::RenderTests::~RenderTests(RenderTests *this)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  
  (this->super_ImageTests).super_TestCaseGroup.super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RenderTests_02167440;
  lVar3 = 0;
  do {
    plVar1 = *(long **)((long)&(this->m_renderActions).m_actions[0x1f].action.
                               super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                               .m_data.ptr + lVar3);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
      *(undefined8 *)
       ((long)&(this->m_renderActions).m_actions[0x1f].action.
               super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
               .m_data.ptr + lVar3) = 0;
    }
    plVar2 = (long *)((this->m_renderActions).m_actions[0x1f].label.field_2._M_local_buf + lVar3);
    plVar1 = *(long **)((long)&(this->m_renderActions).m_actions[0x1f].label._M_dataplus._M_p +
                       lVar3);
    if (plVar2 != plVar1) {
      operator_delete(plVar1,*plVar2 + 1);
    }
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != -0x600);
  (this->super_ImageTests).super_TestCaseGroup.super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageTests_02167478;
  lVar3 = 0x600;
  do {
    plVar1 = *(long **)((long)(this->super_ImageTests).m_createActions.m_actions + lVar3 + -0x10);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
      *(undefined8 *)((long)(this->super_ImageTests).m_createActions.m_actions + lVar3 + -0x10) = 0;
    }
    plVar2 = (long *)((long)(this->super_ImageTests).m_createActions.m_actions + lVar3 + -0x20);
    plVar1 = *(long **)((long)((this->super_ImageTests).m_createActions.m_actions + -1) + lVar3);
    if (plVar2 != plVar1) {
      operator_delete(plVar1,*plVar2 + 1);
    }
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != 0);
  TestCaseGroup::~TestCaseGroup((TestCaseGroup *)this);
  operator_delete(this,0xc88);
  return;
}

Assistant:

RenderTests				(EglTestContext& eglTestCtx, const string& name, const string& desc)
												: ImageTests			(eglTestCtx, name, desc) {}